

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Walker<OptimizeForJS,_wasm::Visitor<OptimizeForJS,_void>_>::walkFunctionInModule
          (Walker<OptimizeForJS,_wasm::Visitor<OptimizeForJS,_void>_> *this,Function *func,
          Module *module)

{
  Module *module_local;
  Function *func_local;
  Walker<OptimizeForJS,_wasm::Visitor<OptimizeForJS,_void>_> *this_local;
  
  setModule(this,module);
  setFunction(this,func);
  doWalkFunction(this,func);
  Visitor<OptimizeForJS,_void>::visitFunction((Visitor<OptimizeForJS,_void> *)this,func);
  setFunction(this,(Function *)0x0);
  setModule(this,(Module *)0x0);
  return;
}

Assistant:

void walkFunctionInModule(Function* func, Module* module) {
    setModule(module);
    setFunction(func);
    static_cast<SubType*>(this)->doWalkFunction(func);
    static_cast<SubType*>(this)->visitFunction(func);
    setFunction(nullptr);
    setModule(nullptr);
  }